

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pySRUP_Observed.cpp
# Opt level: O0

void set_encrypted_data_keystring(SRUP_MSG_OBS_BASE *self,string *s,char *key)

{
  char cVar1;
  uint16_t length;
  ulong uVar2;
  uint8_t *data;
  char *key_local;
  string *s_local;
  SRUP_MSG_OBS_BASE *self_local;
  
  uVar2 = std::__cxx11::string::length();
  if (uVar2 < 0x20) {
    cVar1 = std::__cxx11::string::length();
    std::__cxx11::string::append((ulong)s,' ' - cVar1);
  }
  data = (uint8_t *)std::__cxx11::string::c_str();
  length = std::__cxx11::string::length();
  SRUP_MSG_OBS_BASE::encrypt_data(self,data,length,true,key);
  return;
}

Assistant:

void set_encrypted_data_keystring (SRUP_MSG_OBS_BASE& self, std::string s, char* key)
{
    // As above, by definition our encrypted data will be 16-bytes in length.
    // But we'll expect that for type-conversion with Python, we'll actually use a 32-character string
    // We don't need to trim it if it's longer - as the underlying method will take care of that for us
    // Given that we're specifying the length of 32 here...
    // If it's less than 32 chars – we'll pad it with 0's
    if (s.length() < 32)
        s.append(32-s.length(), 0);

    self.encrypt_data((uint8_t*) s.c_str(), s.length(), true, key);
}